

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void md5_str(MD5_DIGEST digest,char *str,size_t max_len)

{
  size_t in_RCX;
  char *in_RDX;
  long in_FS_OFFSET;
  uchar local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  digest_str(local_18,0x10,in_RDX,in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void md5_str(MD5_DIGEST digest, char *str, size_t max_len)
{
	digest_str(digest.data, sizeof(digest.data), str, max_len);
}